

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O3

Expression *
slang::ast::ConversionExpression::makeImplicit
          (ASTContext *context,Type *targetType,ConversionKind conversionKind,Expression *expr,
          Expression *parentExpr,SourceRange operatorRange)

{
  Compilation *this;
  ConversionExpression *targetType_00;
  Expression *op;
  ConversionKind in_stack_ffffffffffffffb8;
  Expression *local_40;
  ConversionKind local_34;
  
  this = ((context->scope).ptr)->compilation;
  local_40 = expr;
  local_34 = conversionKind;
  Expression::selfDetermined(context,&local_40);
  targetType_00 =
       BumpAllocator::
       emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange&>
                 (&this->super_BumpAllocator,targetType,&local_34,local_40,&local_40->sourceRange);
  (targetType_00->implicitOpRange).startLoc = operatorRange.startLoc;
  (targetType_00->implicitOpRange).endLoc = operatorRange.endLoc;
  if ((local_34 < StreamingConcat) && (((context->flags).m_bits & 2) == 0)) {
    checkImplicitConversions
              ((ConversionExpression *)context,(ASTContext *)(local_40->type).ptr,targetType,
               (Type *)targetType_00,parentExpr,(Expression *)(ulong)local_34,operatorRange,
               in_stack_ffffffffffffffb8);
  }
  return &targetType_00->super_Expression;
}

Assistant:

Expression& ConversionExpression::makeImplicit(const ASTContext& context, const Type& targetType,
                                               ConversionKind conversionKind, Expression& expr,
                                               const Expression* parentExpr,
                                               SourceRange operatorRange) {
    auto& comp = context.getCompilation();
    SLANG_ASSERT(expr.isImplicitlyAssignableTo(comp, targetType));

    Expression* op = &expr;
    selfDetermined(context, op);

    auto result = comp.emplace<ConversionExpression>(targetType, conversionKind, *op,
                                                     op->sourceRange);
    result->implicitOpRange = operatorRange;

    if ((conversionKind == ConversionKind::Implicit ||
         conversionKind == ConversionKind::Propagated) &&
        !context.inUnevaluatedBranch()) {
        checkImplicitConversions(context, *op->type, targetType, *result, parentExpr, operatorRange,
                                 conversionKind);
    }

    return *result;
}